

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

int Abc_ZddIntersect(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddObj *pAVar2;
  Abc_ZddEnt *pAVar3;
  uint Var;
  int iVar4;
  uint uVar5;
  int a_00;
  uint uVar6;
  
  do {
    a_00 = a;
    a = b;
    if (a_00 == 0) {
      return 0;
    }
    if (a == 0) {
      return 0;
    }
    if (a_00 == a) {
      return a_00;
    }
    b = a_00;
  } while (a < a_00);
  pAVar3 = p->pCache;
  uVar6 = a_00 * 0xc00005 + a * 0x40f1f9 + 0x2d4144;
  p->nCacheLookups = p->nCacheLookups + 1;
  uVar5 = p->nCacheMask & uVar6;
  if ((((pAVar3[uVar5].Arg0 != a_00) || (pAVar3[uVar5].Arg1 != a)) || (pAVar3[uVar5].Arg2 != 4)) ||
     (iVar4 = pAVar3[uVar5].Res, iVar4 < 0)) {
    pAVar1 = p->pObjs + a_00;
    pAVar2 = p->pObjs + a;
    if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
      iVar4 = Abc_ZddIntersect(p,pAVar1->False,a);
      uVar5 = pAVar1->True;
    }
    else if ((*(uint *)pAVar2 & 0x7fffffff) < (*(uint *)pAVar1 & 0x7fffffff)) {
      iVar4 = Abc_ZddIntersect(p,a_00,pAVar2->False);
      uVar5 = pAVar2->True;
    }
    else {
      iVar4 = Abc_ZddIntersect(p,pAVar1->False,pAVar2->False);
      uVar5 = Abc_ZddIntersect(p,pAVar1->True,pAVar2->True);
    }
    Var = *(uint *)pAVar2 & 0x7fffffff;
    if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
      Var = *(uint *)pAVar1 & 0x7fffffff;
    }
    iVar4 = Abc_ZddUniqueCreate(p,Var,uVar5,iVar4);
    pAVar3 = p->pCache;
    uVar6 = uVar6 & p->nCacheMask;
    pAVar3[uVar6].Arg0 = a_00;
    pAVar3[uVar6].Arg1 = a;
    pAVar3[uVar6].Arg2 = 4;
    pAVar3[uVar6].Res = iVar4;
    p->nCacheMisses = p->nCacheMisses + 1;
    if (iVar4 < 0) {
      __assert_fail("Res >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                    ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
    }
  }
  return iVar4;
}

Assistant:

int Abc_ZddIntersect( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, r;
    if ( a == 0 ) return 0;
    if ( b == 0 ) return 0;
    if ( a == b ) return a;
    if ( a > b )  return Abc_ZddIntersect( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_INTER)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddIntersect( p, A->False, b ), 
        r1 = A->True;
    else if ( A->Var > B->Var )
        r0 = Abc_ZddIntersect( p, a, B->False ), 
        r1 = B->True;
    else
        r0 = Abc_ZddIntersect( p, A->False, B->False ), 
        r1 = Abc_ZddIntersect( p, A->True, B->True );
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_INTER, r );
}